

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiVectorKey>(aiVectorKey **dest,ai_uint num)

{
  undefined8 *puVar1;
  aiVectorKey *__src;
  aiVectorKey *__dest;
  long lVar2;
  ulong __n;
  
  __src = *dest;
  if (__src != (aiVectorKey *)0x0) {
    __n = (ulong)num * 0x18;
    __dest = (aiVectorKey *)operator_new__(__n);
    if (num != 0) {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)&(__dest->mValue).z + lVar2) = 0;
        puVar1 = (undefined8 *)((long)&__dest->mTime + lVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar2 = lVar2 + 0x18;
      } while (__n - lVar2 != 0);
    }
    *dest = __dest;
    memcpy(__dest,__src,__n);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}